

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O0

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::check_value_bin_4>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,double>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,double *data)

{
  uint8_t *bytes_00;
  parse_error *this;
  allocator local_71;
  string local_70;
  uint32_t local_4c;
  undefined1 local_48 [4];
  uint32_t hex_4b;
  string bytes;
  double *data_local;
  ovf_segment *segment_local;
  ovf_file *f_local;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  
  bytes.field_2._8_8_ = data;
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string((string *)local_48,in);
  bytes_00 = (uint8_t *)std::__cxx11::string::c_str();
  local_4c = endian::from_little_32(bytes_00);
  if (local_4c != 0x4996b438) {
    this = (parse_error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"the expected binary check value could not be parsed!",&local_71)
    ;
    tao::pegtl::parse_error::
    parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
              (this,&local_70,in);
    __cxa_throw(this,&tao::pegtl::parse_error::typeinfo,tao::pegtl::parse_error::~parse_error);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                std::string bytes = in.string();
                uint32_t hex_4b = endian::from_little_32(reinterpret_cast<const uint8_t *>( bytes.c_str() ));

                if( hex_4b != check::val_4b )
                    throw tao::pegtl::parse_error( "the expected binary check value could not be parsed!", in );
            }